

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopologyException.cpp
# Opt level: O0

void __thiscall MeshLib::TopologyException::what(TopologyException *this)

{
  ostream *this_00;
  TopologyException *this_local;
  
  this_00 = std::operator<<((ostream *)&std::cout,this->msg);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
TopologyException::what()
{
	std::cout << msg << std::endl;
}